

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TokenStreamRecognitionException.hpp
# Opt level: O0

string * __thiscall
antlr::TokenStreamRecognitionException::toString_abi_cxx11_(TokenStreamRecognitionException *this)

{
  long *in_RSI;
  string *in_RDI;
  RecognitionException *in_stack_00000098;
  string local_50 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc8;
  string local_30 [48];
  
  RecognitionException::getFileLineColumnString_abi_cxx11_(in_stack_00000098);
  (**(code **)(*in_RSI + 0x18))(local_50);
  std::operator+(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  std::__cxx11::string::~string(local_50);
  std::__cxx11::string::~string(local_30);
  return in_RDI;
}

Assistant:

string toString() const
	{
		return recog.getFileLineColumnString()+getMessage();
	}